

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeneratedSaxParserParserTemplate.h
# Opt level: O0

bool __thiscall
GeneratedSaxParser::
ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
::textData(ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
           *this,ParserChar *text,size_t textLength)

{
  _Elt_pointer pEVar1;
  byte bVar2;
  bool bVar3;
  reference pvVar4;
  pointer ppVar5;
  ulong uVar6;
  long *plVar7;
  undefined8 in_RDX;
  undefined8 in_RSI;
  deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
  *in_RDI;
  FunctionStruct *functions;
  ElementFunctionMap *functionMapToUse;
  const_iterator it;
  ElementData elementData;
  map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
  *in_stack_ffffffffffffff78;
  code *pcVar8;
  _Self local_60;
  _Base_ptr local_58;
  _Elt_pointer local_50;
  _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
  local_48;
  StringHash local_40;
  StringHash local_38;
  size_t local_30;
  void *local_28;
  undefined8 local_20;
  undefined8 local_18;
  bool local_1;
  
  if (in_RDI[5].
      super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
      ._M_impl.super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0) {
    if (in_RDI[6].
        super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
        ._M_impl.super__Deque_impl_data._M_map == (_Map_pointer)0x0) {
      if (in_RDI[6].
          super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
          ._M_impl.super__Deque_impl_data._M_map_size == 0) {
        local_20 = in_RDX;
        local_18 = in_RSI;
        bVar3 = std::
                deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                ::empty((deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                         *)0x8d1e73);
        if (bVar3) {
          local_1 = false;
        }
        else {
          pvVar4 = std::
                   deque<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                   ::back(in_RDI);
          local_40 = pvVar4->elementHash;
          local_38 = pvVar4->generatedElementHash;
          local_30 = pvVar4->typeID;
          local_28 = pvVar4->validationData;
          std::
          _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
          ::_Rb_tree_const_iterator(&local_48);
          if (in_RDI[3].
              super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
              ._M_impl.super__Deque_impl_data._M_start._M_cur == (_Elt_pointer)0x0) {
            local_50 = (_Elt_pointer)
                       &in_RDI[2].
                        super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
          }
          else {
            local_50 = in_RDI[3].
                       super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                       ._M_impl.super__Deque_impl_data._M_start._M_cur;
          }
          local_58 = (_Base_ptr)
                     std::
                     map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
                     ::find(in_stack_ffffffffffffff78,(key_type *)0x8d1f06);
          local_48._M_node = local_58;
          local_60._M_node =
               (_Base_ptr)
               std::
               map<unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>_>
               ::end(in_stack_ffffffffffffff78);
          bVar3 = std::operator==(&local_48,&local_60);
          if (bVar3) {
            local_1 = true;
          }
          else {
            ppVar5 = std::
                     _Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
                     ::operator->((_Rb_tree_const_iterator<std::pair<const_unsigned_long,_GeneratedSaxParser::ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>::FunctionStruct>_>
                                   *)0x8d1f50);
            if ((ppVar5->second).textDataFunction != 0) {
              pcVar8 = (code *)(ppVar5->second).textDataFunction;
              plVar7 = (long *)((long)&(in_RDI->
                                       super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                                       )._M_impl.super__Deque_impl_data._M_map +
                               *(long *)&(ppVar5->second).field_0x18);
              if (((ulong)pcVar8 & 1) != 0) {
                pcVar8 = *(code **)(pcVar8 + *plVar7 + -1);
              }
              uVar6 = (*pcVar8)(plVar7,local_18,local_20);
              if ((uVar6 & 1) != 0) {
                return true;
              }
            }
            local_1 = false;
          }
        }
      }
      else {
        plVar7 = (long *)in_RDI[4].
                         super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
                         ._M_impl.super__Deque_impl_data._M_map_size;
        bVar2 = (**(code **)(*plVar7 + 0x20))(plVar7,in_RSI,in_RDX);
        local_1 = (bool)(bVar2 & 1);
      }
    }
    else if (in_RDI[3].
             super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
             ._M_impl.super__Deque_impl_data._M_start._M_last == (_Elt_pointer)0x0) {
      local_1 = true;
    }
    else {
      pEVar1 = in_RDI[3].
               super__Deque_base<GeneratedSaxParser::ParserTemplateBase::ElementData,_std::allocator<GeneratedSaxParser::ParserTemplateBase::ElementData>_>
               ._M_impl.super__Deque_impl_data._M_start._M_last;
      bVar2 = (**(code **)(pEVar1->elementHash + 0x20))(pEVar1,in_RSI,in_RDX);
      local_1 = (bool)(bVar2 & 1);
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

bool ParserTemplate<DerivedClass, ImplClass>::textData(const ParserChar* text,
															  size_t textLength)
	{
        if ( mIgnoreElements > 0 )
        {
            return true;
        }
        if ( mUnknownElements > 0 )
        {
            if ( mUnknownHandler != 0 )
            {
                return mUnknownHandler->textData( text, textLength );
            }
            else
            {
                return true;
            }
        }
        if ( mNamespaceElements > 0 )
        {
            return mActiveNamespaceHandler->textData( text, textLength );
        }

        if ( mElementDataStack.empty() )
            return false;
        ElementData elementData = mElementDataStack.back();
        typename ElementFunctionMap::const_iterator it;

        const ElementFunctionMap* functionMapToUse;
        if ( mCurrentElementFunctionMap )
            functionMapToUse = mCurrentElementFunctionMap;
        else
            functionMapToUse = &mElementFunctionMap;
		it = functionMapToUse->find(elementData.generatedElementHash);
		if ( it == functionMapToUse->end() )
			return true;
		const FunctionStruct& functions = it->second;

		if ( !functions.textDataFunction || !(static_cast<DerivedClass*>(this)->*functions.textDataFunction)(text, textLength) )
			return false;

		return true;
	}